

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t _elemsize;
  void *pvVar3;
  int *piVar4;
  Mat *pMVar5;
  pointer piVar6;
  int iVar7;
  uint uVar8;
  uint _h;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint _w;
  size_type __n;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  float *pfVar21;
  long lVar22;
  int iVar23;
  void *pvVar24;
  float fVar25;
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_180;
  allocator_type local_171;
  ulong local_170;
  ulong local_168;
  float *local_160;
  float *local_158;
  void *local_150;
  ulong local_148;
  Mat *local_140;
  ConvolutionDepthWise *local_138;
  float *local_130;
  long local_128;
  ulong local_120;
  long local_118;
  void *local_110;
  long local_108;
  ulong local_100;
  void *local_f8;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  long local_d0;
  ulong local_c8;
  void *local_c0;
  void *local_b8;
  int local_b0;
  uint local_ac;
  Mat local_a8;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar7 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar7;
  }
  iVar7 = bottom_blob->c;
  iVar23 = -100;
  if ((iVar7 % this->group == 0) && (this->num_output % this->group == 0)) {
    _elemsize = bottom_blob->elemsize;
    iVar1 = this->kernel_w;
    iVar2 = this->kernel_h;
    iVar9 = this->dilation_w;
    iVar11 = this->dilation_h;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.c = 0;
    local_a8.cstep = 0;
    make_padding(this,bottom_blob,&local_a8,opt);
    iVar23 = -100;
    if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
      local_148 = CONCAT44(local_148._4_4_,iVar7);
      iVar7 = local_a8.w;
      uVar16 = (long)(~((iVar1 + -1) * iVar9) + local_a8.w) / (long)this->stride_w;
      uVar12 = uVar16 & 0xffffffff;
      uVar14 = (long)(~((iVar2 + -1) * iVar11) + local_a8.h) / (long)this->stride_h;
      uVar8 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar8;
      local_140 = top_blob;
      std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_171);
      piVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar5 = local_140;
      _w = (int)uVar16 + 1;
      _h = (int)uVar14 + 1;
      local_160 = (float *)(ulong)_h;
      if (0 < this->kernel_h) {
        iVar23 = this->dilation_h;
        iVar1 = this->dilation_w;
        iVar2 = this->kernel_w;
        iVar9 = 0;
        iVar11 = 0;
        iVar13 = 0;
        do {
          if (0 < this->kernel_w) {
            lVar17 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar9 + lVar17] = iVar11;
              iVar11 = iVar11 + this->dilation_w;
              lVar17 = lVar17 + 1;
            } while ((int)lVar17 < this->kernel_w);
            iVar9 = iVar9 + (int)lVar17;
          }
          iVar11 = iVar11 + (iVar7 * iVar23 - iVar1 * iVar2);
          iVar13 = iVar13 + 1;
        } while (iVar13 < this->kernel_h);
      }
      local_e8 = uVar14 & 0xffffffff;
      Mat::create(local_140,_w,_h,this->num_output,_elemsize,opt->blob_allocator);
      iVar23 = -100;
      if ((pMVar5->data != (void *)0x0) && ((long)pMVar5->c * pMVar5->cstep != 0)) {
        iVar7 = this->group;
        local_138 = this;
        if (iVar7 == this->num_output && (int)local_148 == iVar7) {
          local_170 = (ulong)this->group;
          if (0 < (long)local_170) {
            local_f8 = pMVar5->data;
            local_100 = pMVar5->cstep * pMVar5->elemsize;
            pvVar24 = (this->weight_data).data;
            local_108 = CONCAT44(local_108._4_4_,local_a8.w);
            local_110 = local_a8.data;
            local_f0 = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
            local_118 = local_a8.cstep * local_f0;
            local_d0 = (long)(int)_w;
            pvVar15 = (void *)(ulong)_w;
            uVar16 = 0;
            local_150 = pvVar15;
            local_e0 = uVar12;
            do {
              if (-1 < (int)local_e8) {
                local_d8 = (void *)(local_118 * uVar16 + (long)local_110);
                pvVar18 = (void *)(local_100 * uVar16 + (long)local_f8);
                iVar7 = local_138->bias_term;
                local_168 = CONCAT44(local_168._4_4_,local_138->stride_h * (int)local_108);
                local_148 = (ulong)local_138->stride_w;
                uVar14 = (ulong)(local_138->activation_type - 1);
                local_158 = (float *)0x0;
                local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar7);
                local_c8 = uVar14;
                do {
                  if (-1 < (int)local_e0) {
                    local_130 = (float *)(local_138->activation_params).data;
                    pvVar3 = (local_138->bias_data).data;
                    local_140 = (Mat *)(((int)local_168 * (int)local_158) * local_f0 +
                                       (long)local_d8);
                    pvVar20 = (void *)0x0;
                    local_b8 = pvVar18;
                    do {
                      if (iVar7 == 0) {
                        fVar25 = 0.0;
                      }
                      else {
                        fVar25 = *(float *)((long)pvVar3 + uVar16 * 4);
                      }
                      if (0 < (int)uVar8) {
                        uVar12 = 0;
                        do {
                          fVar25 = fVar25 + *(float *)((long)pvVar24 + uVar12 * 4) *
                                            *(float *)((long)&local_140->data +
                                                      (long)piVar6[uVar12] * 4 +
                                                      (long)pvVar20 * local_148 * 4);
                          uVar12 = uVar12 + 1;
                        } while (uVar8 != uVar12);
                      }
                      if ((uint)uVar14 < 4) {
                        switch((long)&switchD_00156453::switchdataD_0017149c +
                               (long)(int)(&switchD_00156453::switchdataD_0017149c)[uVar14]) {
                        case 0x156455:
                          if (fVar25 <= 0.0) {
                            fVar25 = 0.0;
                          }
                          break;
                        case 0x156462:
                          if (fVar25 <= *local_130) {
                            fVar25 = *local_130;
                          }
                          if (local_130[1] < fVar25) {
                            fVar25 = local_130[1];
                          }
                          break;
                        case 0x15647e:
                          fVar25 = expf(-fVar25);
                          pvVar15 = local_150;
                          pvVar18 = local_b8;
                          uVar14 = local_c8;
                          fVar25 = 1.0 / (fVar25 + 1.0);
                          iVar7 = (int)local_c0;
                          break;
                        case 0x1564d3:
                          fVar25 = fVar25 * (float)(~-(uint)(0.0 < fVar25) & (uint)*local_130 |
                                                   -(uint)(0.0 < fVar25) & 0x3f800000);
                        }
                      }
                      *(float *)((long)pvVar18 + (long)pvVar20 * 4) = fVar25;
                      pvVar20 = (void *)((long)pvVar20 + 1);
                    } while (pvVar20 != pvVar15);
                  }
                  pvVar18 = (void *)((long)pvVar18 + local_d0 * 4);
                  local_158 = (float *)((long)local_158 + 1);
                } while (local_158 != local_160);
              }
              uVar16 = uVar16 + 1;
              pvVar24 = (void *)((long)pvVar24 + __n * 4);
            } while (uVar16 != local_170);
          }
        }
        else {
          uVar16 = (long)(int)local_148 / (long)iVar7;
          uVar19 = uVar16 & 0xffffffff;
          uVar14 = (long)this->num_output / (long)iVar7;
          uVar10 = uVar14 & 0xffffffff;
          local_50 = (long)this->group;
          if (0 < local_50) {
            local_110 = pMVar5->data;
            local_118 = pMVar5->cstep * pMVar5->elemsize;
            local_58 = (this->weight_data).data;
            iVar7 = (int)uVar16 * uVar8;
            local_f0 = (long)(int)_w;
            local_ac = (uint)uVar14;
            local_60 = (long)(int)local_ac;
            local_100 = uVar14 & 0xffffffff;
            local_130 = (float *)(ulong)_w;
            local_b0 = iVar7 * local_ac;
            local_f8 = (void *)((long)iVar7 << 2);
            lVar17 = __n << 2;
            local_120 = 0;
            local_128 = 0;
            local_d8 = (void *)CONCAT44(local_d8._4_4_,(int)uVar16);
            uVar14 = local_e8;
            local_e0 = uVar12;
            local_d0 = lVar17;
            do {
              if (0 < (int)uVar10) {
                local_150 = (void *)((long)local_58 + (long)(int)local_120 * 4);
                local_108 = local_128 * local_60;
                iVar23 = (int)uVar19;
                iVar7 = (int)local_128;
                local_170 = 0;
                do {
                  if (-1 < (int)uVar14) {
                    local_158 = (float *)(local_170 + local_108);
                    local_180 = (void *)(local_118 * (long)local_158 + (long)local_110);
                    local_140 = (Mat *)CONCAT44(local_140._4_4_,local_138->bias_term);
                    local_168 = 0;
                    local_148 = (ulong)(local_138->activation_type - 1);
                    do {
                      if (-1 < (int)uVar12) {
                        local_160 = (float *)(local_138->activation_params).data;
                        local_b8 = (local_138->bias_data).data;
                        lVar22 = local_a8.cstep *
                                 CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                        local_c0 = (void *)((long)(local_a8.w * (int)local_168 * local_138->stride_h
                                                  ) * CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) +
                                           (long)local_a8.data);
                        local_c8 = (ulong)local_138->stride_w;
                        pfVar21 = (float *)0x0;
                        do {
                          if ((int)local_140 == 0) {
                            fVar25 = 0.0;
                          }
                          else {
                            fVar25 = *(float *)((long)local_b8 + (long)local_158 * 4);
                          }
                          if (0 < (int)uVar19) {
                            uVar14 = 0;
                            pvVar24 = local_150;
                            do {
                              if (0 < (int)uVar8) {
                                uVar12 = 0;
                                do {
                                  fVar25 = fVar25 + *(float *)((long)pvVar24 + uVar12 * 4) *
                                                    *(float *)((long)local_c0 +
                                                              (long)piVar6[uVar12] * 4 +
                                                              (uVar14 + (uint)(iVar23 * iVar7)) *
                                                              lVar22 + (long)pfVar21 * local_c8 * 4)
                                  ;
                                  uVar12 = uVar12 + 1;
                                } while (uVar8 != uVar12);
                              }
                              uVar14 = uVar14 + 1;
                              pvVar24 = (void *)((long)pvVar24 + lVar17);
                            } while (uVar14 != (uVar16 & 0xffffffff));
                          }
                          if ((uint)local_148 < 4) {
                            switch((long)&switchD_001567c9::switchdataD_0017148c +
                                   (long)(int)(&switchD_001567c9::switchdataD_0017148c)[local_148])
                            {
                            case 0x1567cb:
                              if (fVar25 <= 0.0) {
                                fVar25 = 0.0;
                              }
                              break;
                            case 0x1567d5:
                              if (fVar25 <= *local_160) {
                                fVar25 = *local_160;
                              }
                              if (local_160[1] < fVar25) {
                                fVar25 = local_160[1];
                              }
                              break;
                            case 0x1567ed:
                              fVar25 = expf(-fVar25);
                              uVar19 = (ulong)local_d8 & 0xffffffff;
                              lVar17 = local_d0;
                              fVar25 = 1.0 / (fVar25 + 1.0);
                              break;
                            case 0x156823:
                              fVar25 = fVar25 * (float)(~-(uint)(0.0 < fVar25) & (uint)*local_160 |
                                                       -(uint)(0.0 < fVar25) & 0x3f800000);
                            }
                          }
                          *(float *)((long)local_180 + (long)pfVar21 * 4) = fVar25;
                          pfVar21 = (float *)((long)pfVar21 + 1);
                        } while (pfVar21 != local_130);
                      }
                      local_180 = (void *)((long)local_180 + local_f0 * 4);
                      iVar1 = (int)local_168;
                      local_168 = (ulong)(iVar1 + 1);
                      uVar14 = local_e8;
                      uVar12 = local_e0;
                    } while (iVar1 != (int)local_e8);
                  }
                  local_170 = local_170 + 1;
                  local_150 = (void *)((long)local_150 + (long)local_f8);
                } while (local_170 != local_100);
              }
              local_128 = local_128 + 1;
              local_120 = (ulong)(uint)((int)local_120 + local_b0);
              uVar10 = (ulong)local_ac;
            } while (local_128 != local_50);
          }
        }
        iVar23 = 0;
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    piVar4 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          if (local_a8.data != (void *)0x0) {
            free(local_a8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_a8.allocator + 0x18))();
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    if (activation_type == 1)
                    {
                        sum = std::max(sum, 0.f);
                    }
                    else if (activation_type == 2)
                    {
                        float slope = activation_params[0];
                        sum = sum > 0.f ? sum : sum * slope;
                    }
                    else if (activation_type == 3)
                    {
                        float min = activation_params[0];
                        float max = activation_params[1];
                        if (sum < min)
                            sum = min;
                        if (sum > max)
                            sum = max;
                    }
                    else if (activation_type == 4)
                    {
                        sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[num_output_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const float* sptr = m.row(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[ space_ofs[k] ];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (activation_type == 1)
                        {
                            sum = std::max(sum, 0.f);
                        }
                        else if (activation_type == 2)
                        {
                            float slope = activation_params[0];
                            sum = sum > 0.f ? sum : sum * slope;
                        }
                        else if (activation_type == 3)
                        {
                            float min = activation_params[0];
                            float max = activation_params[1];
                            if (sum < min)
                                sum = min;
                            if (sum > max)
                                sum = max;
                        }
                        else if (activation_type == 4)
                        {
                            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}